

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdBool32x4OperationX86X64.cpp
# Opt level: O0

bool Js::SIMDBool32x4Operation::OpAnyTrue<char>(SIMDValue *simd)

{
  undefined8 in_RDX;
  _x86_SIMDValue _Var1;
  SIMDValue val;
  int mask_8;
  X86SIMDValue x86Simd;
  undefined1 local_30 [8];
  SIMDValue canonSimd;
  SIMDValue *simd_local;
  
  val.field_0.f64[1] = (Type)in_RDX;
  val.field_0.f64[0] = (Type)(simd->field_0).i64[1];
  canonSimd.field_0.f64[1] = (Type)simd;
  _local_30 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
              SIMDUtils::CanonicalizeToBools<char>((SIMDUtils *)(simd->field_0).f64[0],val);
  _Var1 = _x86_SIMDValue::ToX86SIMDValue((SIMDValue *)local_30);
  return ((((((((((((((((undefined1  [16])_Var1.field_0 >> 7 & (undefined1  [16])0x1) !=
                       (undefined1  [16])0x0 ||
                      ((undefined1  [16])_Var1.field_0 >> 0xf & (undefined1  [16])0x1) !=
                      (undefined1  [16])0x0) ||
                     ((undefined1  [16])_Var1.field_0 >> 0x17 & (undefined1  [16])0x1) !=
                     (undefined1  [16])0x0) ||
                    ((undefined1  [16])_Var1.field_0 >> 0x1f & (undefined1  [16])0x1) !=
                    (undefined1  [16])0x0) ||
                   ((undefined1  [16])_Var1.field_0 >> 0x27 & (undefined1  [16])0x1) !=
                   (undefined1  [16])0x0) ||
                  ((undefined1  [16])_Var1.field_0 >> 0x2f & (undefined1  [16])0x1) !=
                  (undefined1  [16])0x0) ||
                 ((undefined1  [16])_Var1.field_0 >> 0x37 & (undefined1  [16])0x1) !=
                 (undefined1  [16])0x0) ||
                ((undefined1  [16])_Var1.field_0 >> 0x3f & (undefined1  [16])0x1) !=
                (undefined1  [16])0x0) ||
               ((undefined1  [16])_Var1.field_0 >> 0x47 & (undefined1  [16])0x1) !=
               (undefined1  [16])0x0) ||
              ((undefined1  [16])_Var1.field_0 >> 0x4f & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) ||
             ((undefined1  [16])_Var1.field_0 >> 0x57 & (undefined1  [16])0x1) !=
             (undefined1  [16])0x0) ||
            ((undefined1  [16])_Var1.field_0 >> 0x5f & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) ||
           ((undefined1  [16])_Var1.field_0 >> 0x67 & (undefined1  [16])0x1) !=
           (undefined1  [16])0x0) ||
          ((undefined1  [16])_Var1.field_0 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0
          ) || ((undefined1  [16])_Var1.field_0 >> 0x77 & (undefined1  [16])0x1) !=
               (undefined1  [16])0x0) || _Var1.field_0._15_1_ < '\0';
}

Assistant:

bool SIMDBool32x4Operation::OpAnyTrue(const SIMDValue& simd)
    {
        SIMDValue canonSimd = SIMDUtils::CanonicalizeToBools<T>(simd); //copy-by-value since we need to modify the copy
        X86SIMDValue x86Simd = X86SIMDValue::ToX86SIMDValue(canonSimd);
        int mask_8 = _mm_movemask_epi8(x86Simd.m128i_value); //latency 3, throughput 1
        return mask_8 != 0;
    }